

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLParser.cxx
# Opt level: O0

void cmXMLParserStartElement(void *parser,char *name,char **atts)

{
  allocator<char> local_41;
  string local_40 [32];
  char **local_20;
  char **atts_local;
  char *name_local;
  void *parser_local;
  
  local_20 = atts;
  atts_local = (char **)name;
  name_local = (char *)parser;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,name,&local_41);
  (**(code **)(*parser + 0x40))(parser,local_40,local_20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

void cmXMLParserStartElement(void* parser, const char* name, const char** atts)
{
  // Begin element handler that is registered with the XML_Parser.
  // This just casts the user data to a cmXMLParser and calls
  // StartElement.
  static_cast<cmXMLParser*>(parser)->StartElement(name, atts);
}